

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O2

void testSharedFrameBuffer(string *tempDir)

{
  Rgba *pRVar1;
  char cVar2;
  ostream *poVar3;
  ulong uVar4;
  RgbaChannels in_R8D;
  Compression in_R9D;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  long local_90;
  Array2D<Imf_2_5::Rgba> p1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  ulong local_50;
  double local_48;
  double local_40;
  double local_38;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Testing reading from and writing to files using\nmultiple threads and a shared framebuffer"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  cVar2 = IlmThread_2_5::supportsThreads();
  if (cVar2 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"   Threading not supported!");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    p1._sizeX = 0x9f;
    p1._sizeY = 0x55b;
    p1._data = (Rgba *)operator_new__(0x1a9c28);
    local_90 = 0;
    iVar10 = 0;
    uVar4 = 0;
    while( true ) {
      if (uVar4 == 0x9f) break;
      iVar9 = iVar10 + (int)((uVar4 & 0xffffffff) / 100) * -10000;
      local_40 = (double)(int)uVar4 * 0.2;
      local_48 = (double)(int)uVar4 * 0.3;
      lVar6 = 0;
      uVar5 = 0;
      local_50 = uVar4;
      while( true ) {
        pRVar1 = p1._data;
        lVar8 = p1._sizeY;
        if (uVar5 == 0x55b) break;
        dVar11 = Imath_2_5::Rand48::nextf
                           ((Rand48 *)&(anonymous_namespace)::rand1,-0.009999999776482582,
                            -0.009999999776482582);
        lVar8 = lVar8 * local_90;
        half::operator=((half *)((long)&(pRVar1->r)._h + lVar8 + lVar6),
                        (float)(dVar11 + (double)(iVar9 + (int)((uVar5 & 0xffffffff) / 100) * -100))
                       );
        local_38 = (double)(int)uVar5;
        dVar11 = sin(local_38 * 0.1 + local_40);
        dVar12 = Imath_2_5::Rand48::nextf
                           ((Rand48 *)&(anonymous_namespace)::rand1,-0.009999999776482582,
                            -0.009999999776482582);
        half::operator=((half *)((long)&(pRVar1->g)._h + lVar6 + lVar8),
                        (float)(dVar11 * 0.5 + 0.5 + dVar12));
        dVar11 = sin(local_38 * 0.1 + local_48);
        dVar12 = Imath_2_5::Rand48::nextf
                           ((Rand48 *)&(anonymous_namespace)::rand1,-0.009999999776482582,
                            -0.009999999776482582);
        half::operator=((half *)((long)&(pRVar1->b)._h + lVar6 + lVar8),
                        (float)(dVar11 * 0.5 + 0.5 + dVar12));
        dVar11 = (double)Imath_2_5::erand48((ushort *)&(anonymous_namespace)::rand1);
        half::operator=((half *)((long)&(pRVar1->a)._h + lVar6 + lVar8),
                        (float)((1.0 - dVar11) * 0.0 + dVar11));
        uVar5 = uVar5 + 1;
        iVar9 = iVar9 + 1;
        lVar6 = lVar6 + 8;
      }
      uVar4 = local_50 + 1;
      iVar10 = iVar10 + 100;
      local_90 = local_90 + 8;
    }
    for (iVar10 = 0; iVar10 != 9; iVar10 = iVar10 + 1) {
      Imf_2_5::setGlobalThreadCount(iVar10 * 3 & 7);
      poVar3 = std::operator<<((ostream *)&std::cout,"number of threads: ");
      iVar9 = Imf_2_5::globalThreadCount();
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar9);
      std::endl<char,std::char_traits<char>>(poVar3);
      for (uVar7 = 0; uVar7 != 10; uVar7 = uVar7 + 1) {
        std::operator+(&local_70,tempDir,"imf_test_rgba.exr");
        iVar9 = (int)&p1;
        anon_unknown.dwarf_23a87f::writeReadRGBA
                  (local_70._M_dataplus._M_p,iVar9,0xf,(Array2D<Imf_2_5::Rgba> *)(ulong)uVar7,in_R8D
                   ,in_R9D);
        std::__cxx11::string::~string((string *)&local_70);
        std::operator+(&local_70,tempDir,"imf_test_rgba.exr");
        anon_unknown.dwarf_23a87f::writeReadRGBA
                  (local_70._M_dataplus._M_p,iVar9,7,(Array2D<Imf_2_5::Rgba> *)(ulong)uVar7,in_R8D,
                   in_R9D);
        std::__cxx11::string::~string((string *)&local_70);
        std::operator+(&local_70,tempDir,"imf_test_rgba.exr");
        anon_unknown.dwarf_23a87f::writeReadRGBA
                  (local_70._M_dataplus._M_p,iVar9,8,(Array2D<Imf_2_5::Rgba> *)(ulong)uVar7,in_R8D,
                   in_R9D);
        std::__cxx11::string::~string((string *)&local_70);
        std::operator+(&local_70,tempDir,"imf_test_rgba.exr");
        anon_unknown.dwarf_23a87f::writeReadRGBA
                  (local_70._M_dataplus._M_p,iVar9,5,(Array2D<Imf_2_5::Rgba> *)(ulong)uVar7,in_R8D,
                   in_R9D);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"ok\n");
    std::endl<char,std::char_traits<char>>(poVar3);
    Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&p1);
  }
  return;
}

Assistant:

void
testSharedFrameBuffer (const std::string &tempDir)
{
    try
    {
	cout << "Testing reading from and writing to files using\n"
		"multiple threads and a shared framebuffer" << endl;

        if (!ILMTHREAD_NAMESPACE::supportsThreads ())
        {
            cout << "   Threading not supported!" << endl << endl;
            return;
        }
                
	const int W = 1371;
	const int H = 159;
        
	Array2D<Rgba> p1 (H, W);
	fillPixels (p1, W, H);
        
        for (int n = 0; n <= 8; n++)
        {
            int numThreads = (n * 3) % 8;

            setGlobalThreadCount (numThreads);
            cout << "number of threads: " << globalThreadCount () << endl;

            for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
            {
                writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
                                W, H, p1,
                                WRITE_RGBA,
                                Compression (comp));

                writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
                                W, H, p1,
                                WRITE_RGB,
                                Compression (comp));

                writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
                                W, H, p1,
                                WRITE_A,
                                Compression (comp));

                writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
                                W, H, p1,
                                RgbaChannels (WRITE_R | WRITE_B),
                                Compression (comp));
            }
        }

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}